

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

void Gia_ManFilterEquivsUsingLatches
               (Gia_Man_t *pGia,int fFlopsOnly,int fFlopsWith,int fUseRiDrivers)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  int Num;
  int Id;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  uint *puVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  
  if (fFlopsOnly == fFlopsWith) {
    __assert_fail("fFlopsOnly ^ fFlopsWith",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                  ,0x9c1,"void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)");
  }
  p = Vec_IntAlloc(100);
  iVar7 = pGia->nObjs;
  p_00 = Vec_IntAlloc(iVar7);
  p_00->nSize = iVar7;
  if (p_00->pArray != (int *)0x0) {
    memset(p_00->pArray,0,(long)iVar7 << 2);
  }
  iVar7 = 0;
  if (fUseRiDrivers == 0) {
    while ((iVar7 < pGia->nRegs &&
           (pGVar4 = Gia_ManCi(pGia,(pGia->vCis->nSize - pGia->nRegs) + iVar7),
           pGVar4 != (Gia_Obj_t *)0x0))) {
      iVar3 = Gia_ObjId(pGia,pGVar4);
      Vec_IntWriteEntry(p_00,iVar3,1);
      iVar7 = iVar7 + 1;
    }
  }
  else {
    while ((iVar7 < pGia->nRegs &&
           (pGVar4 = Gia_ManCo(pGia,(pGia->vCos->nSize - pGia->nRegs) + iVar7),
           pGVar4 != (Gia_Obj_t *)0x0))) {
      iVar3 = Gia_ObjFaninId0p(pGia,pGVar4);
      Vec_IntWriteEntry(p_00,iVar3,1);
      iVar7 = iVar7 + 1;
    }
  }
  uVar8 = 0;
  uVar9 = 0;
  for (lVar11 = 1; uVar5 = (ulong)pGia->nObjs, lVar11 < (long)uVar5; lVar11 = lVar11 + 1) {
    if (((uint)pGia->pReprs[lVar11] & 0xfffffff) == 0) {
      if (pGia->pNexts[lVar11] != 0) {
        __assert_fail("pGia->pNexts[i] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                      ,0x9d3,"void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)");
      }
      uVar8 = uVar8 + 1;
      iVar7 = Vec_IntEntry(p_00,(int)lVar11);
      if (iVar7 == 0) {
        pGia->pReprs[lVar11] = (Gia_Rpr_t)((uint)pGia->pReprs[lVar11] | 0xfffffff);
      }
      else {
        uVar9 = uVar9 + 1;
      }
    }
  }
  uVar12 = 1;
  if (fFlopsOnly == 0) {
    for (; (long)uVar12 < (long)(int)uVar5; uVar12 = uVar12 + 1) {
      iVar7 = Gia_ObjIsHead(pGia,(int)uVar12);
      uVar13 = uVar9;
      if (iVar7 != 0) {
        uVar8 = uVar8 - 1;
        uVar13 = uVar9 - 1;
        bVar2 = false;
        for (uVar5 = uVar12; 0 < (int)uVar5; uVar5 = (ulong)(uint)pGia->pNexts[uVar5 & 0xffffffff])
        {
          iVar7 = Vec_IntEntry(p_00,(int)uVar5);
          if (iVar7 != 0) {
            bVar2 = true;
          }
          uVar8 = uVar8 + 1;
          uVar13 = uVar13 + 1;
          uVar9 = uVar9 + 1;
        }
        if (!bVar2) {
          puVar6 = (uint *)(pGia->pNexts + uVar12);
          uVar5 = uVar12 & 0xffffffff;
          while (iVar7 = (int)uVar5, iVar7 != 0) {
            uVar13 = *puVar6;
            pGia->pReprs[iVar7] = (Gia_Rpr_t)((uint)pGia->pReprs[iVar7] | 0xfffffff);
            piVar1 = pGia->pNexts;
            piVar1[iVar7] = 0;
            puVar6 = (uint *)(piVar1 + (int)uVar13);
            uVar9 = uVar9 - 1;
            uVar5 = (ulong)uVar13;
          }
          iVar7 = Gia_ObjIsHead(pGia,(int)uVar12);
          uVar13 = uVar9;
          if (iVar7 != 0) {
            __assert_fail("!Gia_ObjIsHead(pGia, i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                          ,0xa16,"void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)")
            ;
          }
        }
      }
      uVar9 = uVar13;
      uVar5 = (ulong)(uint)pGia->nObjs;
    }
  }
  else {
    for (; (long)uVar12 < (long)(int)uVar5; uVar12 = uVar12 + 1) {
      iVar7 = Gia_ObjIsHead(pGia,(int)uVar12);
      if (iVar7 != 0) {
        p->nSize = 0;
        uVar8 = uVar8 - 1;
        for (uVar5 = uVar12; iVar7 = (int)uVar5, 0 < iVar7;
            uVar5 = (ulong)(uint)pGia->pNexts[uVar5 & 0xffffffff]) {
          iVar3 = Vec_IntEntry(p_00,iVar7);
          if (iVar3 != 0) {
            Vec_IntPush(p,iVar7);
          }
          uVar8 = uVar8 + 1;
        }
        puVar6 = (uint *)(pGia->pNexts + uVar12);
        uVar5 = uVar12 & 0xffffffff;
        while (iVar7 = (int)uVar5, iVar7 != 0) {
          uVar13 = *puVar6;
          pGia->pReprs[iVar7] = (Gia_Rpr_t)((uint)pGia->pReprs[iVar7] | 0xfffffff);
          piVar1 = pGia->pNexts;
          piVar1[iVar7] = 0;
          puVar6 = (uint *)(piVar1 + (int)uVar13);
          uVar5 = (ulong)uVar13;
        }
        iVar7 = Gia_ObjIsHead(pGia,(int)uVar12);
        if (iVar7 != 0) {
          __assert_fail("!Gia_ObjIsHead(pGia, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                        ,0x9ed,"void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)");
        }
        iVar7 = p->nSize;
        if (1 < iVar7) {
          Num = Vec_IntEntry(p,0);
          iVar10 = Num;
          for (iVar3 = 1; iVar7 != iVar3; iVar3 = iVar3 + 1) {
            Id = Vec_IntEntry(p,iVar3);
            Gia_ObjSetRepr(pGia,Id,Num);
            pGia->pNexts[iVar10] = Id;
            iVar10 = Id;
          }
          if (pGia->pNexts[iVar10] != 0) {
            __assert_fail("Gia_ObjNext(pGia, iPrev) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                          ,0x9f9,"void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)")
            ;
          }
          uVar9 = (uVar9 - 1) + iVar7;
        }
      }
      uVar5 = (ulong)(uint)pGia->nObjs;
    }
  }
  Vec_IntFree(p);
  Vec_IntFree(p_00);
  Abc_Print(1,"The number of literals: Before = %d. After = %d.\n",(ulong)uVar8,(ulong)uVar9);
  return;
}

Assistant:

void Gia_ManFilterEquivsUsingLatches( Gia_Man_t * pGia, int fFlopsOnly, int fFlopsWith, int fUseRiDrivers )
{
    Gia_Obj_t * pObjR;
    Vec_Int_t * vNodes, * vFfIds;
    int i, k, iObj, iNext, iPrev, iRepr;
    int iLitsOld = 0, iLitsNew = 0;
    assert( fFlopsOnly ^ fFlopsWith );
    vNodes = Vec_IntAlloc( 100 );
    // select nodes "flop" node IDs
    vFfIds = Vec_IntStart( Gia_ManObjNum(pGia) );
    if ( fUseRiDrivers )
    {
        Gia_ManForEachRi( pGia, pObjR, i )
            Vec_IntWriteEntry( vFfIds, Gia_ObjFaninId0p(pGia, pObjR), 1 );
    }
    else
    {
        Gia_ManForEachRo( pGia, pObjR, i )
            Vec_IntWriteEntry( vFfIds, Gia_ObjId(pGia, pObjR), 1 );
    }
    // remove all non-flop constants
    Gia_ManForEachConst( pGia, i )
    {
        iLitsOld++;
        assert( pGia->pNexts[i] == 0 );
        if ( !Vec_IntEntry(vFfIds, i) )
            Gia_ObjUnsetRepr( pGia, i );
        else
            iLitsNew++;
    }
    // clear the classes
    if ( fFlopsOnly )
    {
        Gia_ManForEachClass( pGia, i )
        {
            Vec_IntClear( vNodes );
            Gia_ClassForEachObj( pGia, i, iObj )
            {
                if ( Vec_IntEntry(vFfIds, iObj) )
                    Vec_IntPush( vNodes, iObj );
                iLitsOld++;
            }
            iLitsOld--;
            // undo equivalence classes
            for ( iObj = i, iNext = Gia_ObjNext(pGia, iObj); iObj;
                  iObj = iNext, iNext = Gia_ObjNext(pGia, iObj) )
            {
                Gia_ObjUnsetRepr( pGia, iObj );
                Gia_ObjSetNext( pGia, iObj, 0 );
            }
            assert( !Gia_ObjIsHead(pGia, i) );
            if ( Vec_IntSize(vNodes) > 1 )
            {
                // create new class
                iPrev = iRepr = Vec_IntEntry( vNodes, 0 );
                Vec_IntForEachEntryStart( vNodes, iObj, k, 1 )
                {
                    Gia_ObjSetRepr( pGia, iObj, iRepr );
                    Gia_ObjSetNext( pGia, iPrev, iObj );
                    iPrev = iObj;
                    iLitsNew++;
                }
                assert( Gia_ObjNext(pGia, iPrev) == 0 );
            }
        }
    }
    else
    {
        Gia_ManForEachClass( pGia, i )
        {
            int fSeenFlop = 0;
            Gia_ClassForEachObj( pGia, i, iObj )
            {
                if ( Vec_IntEntry(vFfIds, iObj) )
                    fSeenFlop = 1;
                iLitsOld++;
                iLitsNew++;
            }
            iLitsOld--;
            iLitsNew--;
            if ( fSeenFlop )
                continue;
            // undo equivalence classes
            for ( iObj = i, iNext = Gia_ObjNext(pGia, iObj); iObj;
                  iObj = iNext, iNext = Gia_ObjNext(pGia, iObj) )
            {
                Gia_ObjUnsetRepr( pGia, iObj );
                Gia_ObjSetNext( pGia, iObj, 0 );
                iLitsNew--;
            }
            iLitsNew++;
            assert( !Gia_ObjIsHead(pGia, i) );
        }
    }
    Vec_IntFree( vNodes );
    Vec_IntFree( vFfIds );
    Abc_Print( 1, "The number of literals: Before = %d. After = %d.\n", iLitsOld, iLitsNew );
}